

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  ImGuiTabItem *pIVar2;
  short sVar3;
  int iVar4;
  uint uVar5;
  float fVar6;
  ImGuiWindow *pIVar7;
  ImDrawList *draw_list;
  ImVec2 IVar8;
  uint3 uVar9;
  ImGuiContext *pIVar10;
  char *label_00;
  ulong uVar11;
  bool bVar12;
  ImU32 IVar13;
  int iVar14;
  undefined4 uVar15;
  ImGuiID close_button_id;
  ulong uVar16;
  ImGuiTabItem *pIVar17;
  size_t sVar18;
  ulong extraout_RAX;
  undefined7 uVar20;
  char *pcVar19;
  int iVar21;
  ImGuiTabItem *pIVar22;
  int iVar23;
  ImGuiTabItem *pIVar24;
  ImGuiCol idx;
  ulong uVar25;
  uint flags_00;
  int iVar26;
  undefined1 uVar27;
  bool bVar28;
  uint uVar29;
  float fVar30;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar31;
  float fVar32;
  ImVec2 IVar33;
  bool text_clipped;
  bool just_closed;
  ImU32 local_c4;
  ImGuiTextBuffer *local_c0;
  ImRect bb;
  bool hovered;
  undefined7 uStack_77;
  float fStack_74;
  bool held;
  float local_6c;
  bool *local_68;
  int local_5c;
  undefined1 local_58 [24];
  char *local_40;
  ImGuiContext *local_38;
  
  pIVar24 = (ImGuiTabItem *)(ulong)(uint)flags;
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  pIVar10 = GImGui;
  pIVar7 = GImGui->CurrentWindow;
  if (pIVar7->SkipItems != false) {
    return false;
  }
  IVar13 = TabBarCalcTabID(tab_bar,label);
  if ((p_open != (bool *)0x0) && (*p_open == false)) {
    PushItemFlag(0x18,true);
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,IVar13,(ImRect *)0x0,0);
    PopItemFlag();
    return false;
  }
  if (((uint)flags >> 0x15 & 1) != 0 && p_open != (bool *)0x0) {
    __assert_fail("!p_open || !(flags & ImGuiTabItemFlags_Button)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_widgets.cpp"
                  ,0x1e3d,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags)");
  }
  if ((~flags & 0xc0U) == 0) {
    __assert_fail("(flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_widgets.cpp"
                  ,0x1e3e,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags)");
  }
  local_68 = (bool *)0x0;
  flags_00 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    local_68 = p_open;
    flags_00 = flags | 0x100000;
  }
  if (p_open != (bool *)0x0) {
    flags_00 = flags;
  }
  IVar8 = TabItemCalcSize(label,local_68 != (bool *)0x0);
  fVar30 = IVar8.x;
  if (IVar13 == 0) {
LAB_001841d3:
    pIVar24 = (ImGuiTabItem *)0x0;
  }
  else {
    uVar16 = (ulong)(tab_bar->Tabs).Size;
    bVar28 = 0 < (long)uVar16;
    if (0 < (long)uVar16) {
      pIVar24 = (tab_bar->Tabs).Data;
      bVar28 = true;
      if (pIVar24->ID != IVar13) {
        pIVar17 = pIVar24 + (uVar16 - 1);
        uVar11 = 1;
        pIVar22 = pIVar24;
        do {
          uVar25 = uVar11;
          pIVar24 = pIVar17;
          if (uVar16 == uVar25) break;
          pIVar24 = pIVar22 + 1;
          pIVar2 = pIVar22 + 1;
          uVar11 = uVar25 + 1;
          pIVar22 = pIVar24;
        } while (pIVar2->ID != IVar13);
        bVar28 = uVar25 < uVar16;
      }
    }
    if (!bVar28) goto LAB_001841d3;
  }
  local_38 = pIVar10;
  local_58._8_4_ = extraout_XMM0_Dc;
  local_58._0_4_ = IVar8.x;
  local_58._4_4_ = IVar8.y;
  local_58._12_4_ = extraout_XMM0_Dd;
  pIVar22 = pIVar24;
  local_c4 = IVar13;
  if (pIVar24 == (ImGuiTabItem *)0x0) {
    iVar23 = (tab_bar->Tabs).Size;
    iVar4 = (tab_bar->Tabs).Capacity;
    if (iVar23 == iVar4) {
      iVar23 = iVar23 + 1;
      if (iVar4 == 0) {
        iVar21 = 8;
      }
      else {
        iVar21 = iVar4 / 2 + iVar4;
      }
      if (iVar23 < iVar21) {
        iVar23 = iVar21;
      }
      if (iVar4 < iVar23) {
        pIVar17 = (ImGuiTabItem *)MemAlloc((long)iVar23 * 0x28);
        pIVar22 = (tab_bar->Tabs).Data;
        if (pIVar22 != (ImGuiTabItem *)0x0) {
          memcpy(pIVar17,pIVar22,(long)(tab_bar->Tabs).Size * 0x28);
          MemFree((tab_bar->Tabs).Data);
        }
        (tab_bar->Tabs).Data = pIVar17;
        (tab_bar->Tabs).Capacity = iVar23;
        fVar30 = (float)local_58._0_4_;
      }
    }
    pIVar22 = (tab_bar->Tabs).Data;
    iVar23 = (tab_bar->Tabs).Size;
    pIVar22[iVar23].ID = 0;
    pIVar22[iVar23].Flags = 0;
    pIVar22[iVar23].LastFrameVisible = -1;
    pIVar22[iVar23].LastFrameSelected = -1;
    pIVar22[iVar23].Offset = 0.0;
    pIVar22[iVar23].Width = 0.0;
    pIVar22[iVar23].ContentWidth = 0.0;
    pIVar17 = pIVar22 + iVar23;
    pIVar17->NameOffset = -1;
    pIVar17->BeginOrder = -1;
    pIVar17->IndexDuringLayout = -1;
    *(undefined4 *)&pIVar22[iVar23].WantClose = 0;
    iVar23 = (tab_bar->Tabs).Size;
    uVar5 = iVar23 + 1;
    (tab_bar->Tabs).Size = uVar5;
    if (iVar23 < 0) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                    ,0x695,"T &ImVector<ImGuiTabItem>::back() [T = ImGuiTabItem]");
    }
    pIVar17 = (tab_bar->Tabs).Data;
    pIVar22 = pIVar17 + ((ulong)uVar5 - 1);
    pIVar22->ID = local_c4;
    pIVar17[(ulong)uVar5 - 1].Width = fVar30;
    tab_bar->TabsAddedNew = true;
  }
  pIVar17 = (tab_bar->Tabs).Data;
  local_40 = label;
  if ((pIVar22 < pIVar17) || (pIVar17 + (tab_bar->Tabs).Size <= pIVar22)) {
    __assert_fail("it >= Data && it < Data + Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                  ,0x6ac,
                  "int ImVector<ImGuiTabItem>::index_from_ptr(const T *) const [T = ImGuiTabItem]");
  }
  tab_bar->LastTabItemIdx = (short)((uint)((int)pIVar22 - (int)pIVar17) >> 3) * -0x3333;
  pIVar22->ContentWidth = fVar30;
  sVar3 = tab_bar->TabsActiveCount;
  tab_bar->TabsActiveCount = sVar3 + 1;
  pIVar22->BeginOrder = sVar3;
  uVar5 = tab_bar->Flags;
  iVar14 = tab_bar->PrevFrameVisible + 1;
  iVar23 = local_38->FrameCount;
  iVar26 = pIVar22->LastFrameVisible + 1;
  pIVar22->LastFrameVisible = iVar23;
  pIVar22->Flags = flags_00;
  local_c0 = &tab_bar->TabsNames;
  iVar4 = (tab_bar->TabsNames).Buf.Size;
  iVar21 = iVar4 + -1;
  if (iVar4 == 0) {
    iVar21 = 0;
  }
  pIVar22->NameOffset = iVar21;
  sVar18 = strlen(label);
  ImGuiTextBuffer::append(local_c0,label,label + sVar18 + 1);
  pIVar10 = local_38;
  IVar13 = local_c4;
  uVar16 = extraout_RAX;
  if (((iVar26 < iVar23) && ((tab_bar->Flags & 2) != 0)) && (tab_bar->NextSelectedTabId == 0)) {
    if (iVar14 < iVar23) {
      uVar29 = flags_00 & 0x200000 | tab_bar->SelectedTabId;
      uVar16 = (ulong)uVar29;
    }
    else {
      uVar29 = flags_00 >> 0x15 & 1;
    }
    if (uVar29 == 0) {
      tab_bar->NextSelectedTabId = local_c4;
    }
  }
  if ((((flags_00 & 2) != 0) && (tab_bar->SelectedTabId != local_c4)) &&
     (uVar16 = (ulong)(flags_00 & 0x200000), (flags_00 & 0x200000) == 0)) {
    tab_bar->NextSelectedTabId = local_c4;
  }
  uVar20 = (undefined7)(uVar16 >> 8);
  if (tab_bar->VisibleTabId == local_c4) {
    tab_bar->VisibleTabWasSubmitted = true;
    local_c0 = (ImGuiTextBuffer *)CONCAT71(uVar20,1);
  }
  else if ((tab_bar->SelectedTabId == 0 && iVar14 < iVar23) && ((tab_bar->Tabs).Size == 1)) {
    local_c0 = (ImGuiTextBuffer *)CONCAT71(uVar20,(tab_bar->Flags & 2) == 0);
  }
  else {
    local_c0 = (ImGuiTextBuffer *)0x0;
  }
  if ((iVar26 < iVar23) && (pIVar24 == (ImGuiTabItem *)0x0 || iVar23 <= iVar14)) {
    PushItemFlag(0x18,true);
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,IVar13,(ImRect *)0x0,0);
    PopItemFlag();
    return (bool)((flags_00 >> 0x15 & 1) == 0 & (byte)local_c0);
  }
  if (tab_bar->SelectedTabId == local_c4) {
    pIVar22->LastFrameSelected = local_38->FrameCount;
  }
  uVar29 = pIVar22->Flags;
  fVar30 = pIVar22->Width;
  fVar31 = pIVar22->Offset;
  if ((uVar29 & 0xc0) == 0) {
    fVar31 = (float)(int)(fVar31 - tab_bar->ScrollingAnim);
  }
  IVar33.x = fVar31 + (tab_bar->BarRect).Min.x;
  IVar8 = (pIVar7->DC).CursorPos;
  IVar33.y = (tab_bar->BarRect).Min.y + 0.0;
  (pIVar7->DC).CursorPos = IVar33;
  fVar31 = (pIVar7->DC).CursorPos.x;
  fVar6 = (pIVar7->DC).CursorPos.y;
  bb.Min = (pIVar7->DC).CursorPos;
  fVar30 = fVar30 + fVar31;
  fVar32 = (float)local_58._4_4_ + fVar6;
  bb.Max.y = fVar32;
  bb.Max.x = fVar30;
  if ((uVar29 & 0xc0) == 0) {
    uVar9 = (uint3)(uVar29 >> 8);
    uVar15 = (undefined4)CONCAT71((uint7)uVar9,1);
    if (tab_bar->ScrollingRectMinX <= fVar31) {
      uVar15 = CONCAT31(uVar9,tab_bar->ScrollingRectMaxX <= fVar30 &&
                              fVar30 != tab_bar->ScrollingRectMaxX);
    }
  }
  else {
    uVar15 = 0;
  }
  local_58._0_4_ = uVar15;
  local_5c = iVar26;
  if ((char)uVar15 != '\0') {
    uVar29 = -(uint)(tab_bar->ScrollingRectMinX <= fVar31);
    fStack_74 = fVar6 + -1.0;
    _hovered = (float)(~uVar29 & (uint)tab_bar->ScrollingRectMinX | (uint)fVar31 & uVar29);
    _held = tab_bar->ScrollingRectMaxX;
    local_6c = fVar32;
    PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
  }
  IVar33 = (pIVar7->DC).CursorMaxPos;
  fStack_74 = bb.Max.y - bb.Min.y;
  _hovered = bb.Max.x - bb.Min.x;
  ItemSize((ImVec2 *)&hovered,(pIVar10->Style).FramePadding.y);
  IVar13 = local_c4;
  (pIVar7->DC).CursorMaxPos = IVar33;
  bVar28 = ItemAdd(&bb,local_c4,(ImRect *)0x0,0);
  if (!bVar28) {
    uVar27 = SUB81(local_c0,0);
    if (local_58[0] != '\0') {
      PopClipRect();
    }
    (pIVar7->DC).CursorPos = IVar8;
    return (bool)uVar27;
  }
  uVar29 = flags_00 & 0x200000;
  bVar28 = ButtonBehavior(&bb,IVar13,&hovered,&held,
                          (uVar29 >> 0x11) + (uint)pIVar10->DragDropActive * 0x200 + 0x1010);
  label_00 = local_40;
  if ((bVar28) && (uVar29 == 0)) {
    tab_bar->NextSelectedTabId = IVar13;
  }
  hovered = (bool)(hovered | pIVar10->HoveredId == IVar13);
  if (pIVar10->ActiveId != IVar13) {
    SetItemAllowOverlap();
  }
  if (((((held == true) && (iVar23 <= local_5c)) && (bVar12 = IsMouseDragging(0,-1.0), bVar12)) &&
      ((pIVar10->DragDropActive == false && ((tab_bar->Flags & 1) != 0)))) &&
     (((fVar30 = (pIVar10->IO).MouseDelta.x, fVar30 < 0.0 &&
       (pIVar1 = &(pIVar10->IO).MousePos, pIVar1->x <= bb.Min.x && bb.Min.x != pIVar1->x)) ||
      ((0.0 < fVar30 && (bb.Max.x < (pIVar10->IO).MousePos.x)))))) {
    TabBarQueueReorderFromMousePos(tab_bar,pIVar22,(pIVar10->IO).MousePos);
  }
  draw_list = pIVar7->DrawList;
  idx = 0x22;
  if ((held == false) && (hovered == false)) {
    if ((byte)local_c0 == '\0') {
      idx = (uint)((uVar5 >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((uVar5 >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  IVar13 = GetColorU32(idx,1.0);
  TabItemBackground(draw_list,&bb,flags_00,IVar13);
  IVar13 = local_c4;
  RenderNavHighlight(&bb,local_c4,1);
  bVar12 = IsItemHovered(8);
  if (bVar12) {
    bVar12 = IsMouseClicked(1,false);
    if (bVar12) {
      uVar29 = flags_00 >> 0x15 & 1;
    }
    else {
      bVar12 = IsMouseReleased(1);
      if (!bVar12) goto LAB_001847db;
    }
    if (uVar29 == 0) {
      tab_bar->NextSelectedTabId = IVar13;
    }
  }
LAB_001847db:
  IVar13 = local_c4;
  uVar5 = tab_bar->Flags;
  if (local_68 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = GetIDWithSeed("#CLOSE",(char *)0x0,local_c4);
  }
  TabItemLabelAndCloseButton
            (draw_list,&bb,uVar5 >> 1 & 4 | flags_00,tab_bar->FramePadding,label_00,IVar13,
             close_button_id,SUB81(local_c0,0),&just_closed,&text_clipped);
  if ((local_68 != (bool *)0x0) && (just_closed != false)) {
    *local_68 = false;
    TabBarCloseTab(tab_bar,pIVar22);
  }
  if (local_58[0] != '\0') {
    PopClipRect();
  }
  (pIVar7->DC).CursorPos = IVar8;
  if ((((text_clipped == true) && (pIVar10->HoveredId == IVar13)) && (held == false)) &&
     (((pIVar10->TooltipSlowDelay <= pIVar10->HoveredIdNotActiveTimer &&
        pIVar10->HoveredIdNotActiveTimer != pIVar10->TooltipSlowDelay &&
       (bVar12 = IsItemHovered(0), bVar12)) &&
      (((tab_bar->Flags & 0x20) == 0 && ((pIVar22->Flags & 0x10) == 0)))))) {
    pcVar19 = FindRenderedTextEnd(label_00,(char *)0x0);
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar19 - (int)label_00),label_00);
  }
  uVar27 = (char)local_c0;
  if (((flags_00 >> 0x15 & 1) != 0) && (uVar27 = bVar28, tab_bar->SelectedTabId == pIVar22->ID)) {
    __assert_fail("!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_widgets.cpp"
                  ,0x1ef3,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags)");
  }
  return (bool)uVar27;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.LastItemStatusFlags);
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_bar->TabsAddedNew = true;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = (ImS32)tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            if (!is_tab_button)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & ImGuiTabItemFlags_SectionMask_) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > TOOLTIP_DELAY && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (text_clipped && g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}